

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O2

void __thiscall
ncnn::Convolution::make_padding
          (Convolution *this,Mat *bottom_blob,Mat *bottom_blob_bordered,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int left;
  int iVar5;
  int right;
  int iVar6;
  float v;
  Option opt_b;
  
  iVar4 = bottom_blob->w;
  iVar1 = bottom_blob->h;
  iVar5 = (this->kernel_w + -1) * this->dilation_w;
  iVar6 = (this->kernel_h + -1) * this->dilation_h;
  Mat::operator=(bottom_blob_bordered,bottom_blob);
  left = this->pad_left;
  right = this->pad_right;
  if (((right < 1 && left < 1) && (iVar2 = this->pad_top, iVar2 < 1)) &&
     (iVar3 = this->pad_bottom, iVar3 < 1)) {
    if (iVar3 == -0xe9 && (iVar2 == -0xe9 && (right == -0xe9 && left == -0xe9))) {
      iVar5 = iVar5 - (iVar4 + -1) % this->stride_w;
      iVar6 = iVar6 - (iVar1 + -1) % this->stride_h;
      if ((iVar5 < 1) && (iVar6 < 1)) {
        return;
      }
      opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_b.use_packing_layout = opt->use_packing_layout;
      opt_b.use_shader_pack8 = opt->use_shader_pack8;
      opt_b.use_bf16_storage = opt->use_bf16_storage;
      opt_b._36_4_ = *(undefined4 *)&opt->field_0x24;
      opt_b.lightmode = opt->lightmode;
      opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_b.num_threads = opt->num_threads;
      opt_b.workspace_allocator = opt->workspace_allocator;
      opt_b.use_winograd_convolution = opt->use_winograd_convolution;
      opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_b.use_int8_inference = opt->use_int8_inference;
      opt_b.use_vulkan_compute = opt->use_vulkan_compute;
      opt_b.use_fp16_packed = opt->use_fp16_packed;
      opt_b.use_fp16_storage = opt->use_fp16_storage;
      opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_b.use_int8_storage = opt->use_int8_storage;
      opt_b.blob_allocator = opt->workspace_allocator;
      iVar4 = iVar6 / 2;
      iVar6 = iVar6 - iVar4;
      left = iVar5 / 2;
      right = iVar5 - left;
      v = this->pad_value;
    }
    else {
      if (iVar3 != -0xea || (iVar2 != -0xea || (right != -0xea || left != -0xea))) {
        return;
      }
      iVar5 = iVar5 - (iVar4 + -1) % this->stride_w;
      iVar4 = iVar6 - (iVar1 + -1) % this->stride_h;
      if ((iVar5 < 1) && (iVar4 < 1)) {
        return;
      }
      opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_b.use_packing_layout = opt->use_packing_layout;
      opt_b.use_shader_pack8 = opt->use_shader_pack8;
      opt_b.use_bf16_storage = opt->use_bf16_storage;
      opt_b._36_4_ = *(undefined4 *)&opt->field_0x24;
      opt_b.lightmode = opt->lightmode;
      opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_b.num_threads = opt->num_threads;
      opt_b.workspace_allocator = opt->workspace_allocator;
      opt_b.use_winograd_convolution = opt->use_winograd_convolution;
      opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_b.use_int8_inference = opt->use_int8_inference;
      opt_b.use_vulkan_compute = opt->use_vulkan_compute;
      opt_b.use_fp16_packed = opt->use_fp16_packed;
      opt_b.use_fp16_storage = opt->use_fp16_storage;
      opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_b.use_int8_storage = opt->use_int8_storage;
      opt_b.blob_allocator = opt->workspace_allocator;
      iVar6 = iVar4 / 2;
      iVar4 = iVar4 - iVar6;
      right = iVar5 / 2;
      left = iVar5 - right;
      v = this->pad_value;
    }
  }
  else {
    opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_b.use_packing_layout = opt->use_packing_layout;
    opt_b.use_shader_pack8 = opt->use_shader_pack8;
    opt_b.use_bf16_storage = opt->use_bf16_storage;
    opt_b._36_4_ = *(undefined4 *)&opt->field_0x24;
    opt_b.lightmode = opt->lightmode;
    opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_b.num_threads = opt->num_threads;
    opt_b.workspace_allocator = opt->workspace_allocator;
    opt_b.use_winograd_convolution = opt->use_winograd_convolution;
    opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_b.use_int8_inference = opt->use_int8_inference;
    opt_b.use_vulkan_compute = opt->use_vulkan_compute;
    opt_b.use_fp16_packed = opt->use_fp16_packed;
    opt_b.use_fp16_storage = opt->use_fp16_storage;
    opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_b.use_int8_storage = opt->use_int8_storage;
    opt_b.blob_allocator = opt->workspace_allocator;
    iVar4 = this->pad_top;
    iVar6 = this->pad_bottom;
    v = this->pad_value;
  }
  copy_make_border(bottom_blob,bottom_blob_bordered,iVar4,iVar6,left,right,0,v,&opt_b);
  return;
}

Assistant:

void Convolution::make_padding(const Mat& bottom_blob, Mat& bottom_blob_bordered, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    bottom_blob_bordered = bottom_blob;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
    {
        // tensorflow padding=SAME or onnx padding=SAME_UPPER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    else if (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234)
    {
        // onnx padding=SAME_LOWER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
}